

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Oscilloscope.cpp
# Opt level: O2

int Oscilloscope::InternalRegisterEffectDefinition(UnityAudioEffectDefinition *definition)

{
  UnityAudioParameterDefinition *pUVar1;
  
  pUVar1 = (UnityAudioParameterDefinition *)operator_new__(0x100);
  definition->paramdefs = pUVar1;
  RegisterParameter(definition,"Window","s",0.01,2.0,0.1,1.0,3.0,0,"Length of analysis window");
  RegisterParameter(definition,"Scale","%",0.01,10.0,1.0,100.0,3.0,1,
                    "Amplitude scaling for monitored signal");
  RegisterParameter(definition,"Mode","",0.0,3.0,0.0,1.0,1.0,2,
                    "Display mode (0=scope, 1=spectrum, 2=spectrogram)");
  RegisterParameter(definition,"SpectrumDecay","dB/s",-100.0,0.0,-10.0,1.0,1.0,3,
                    "Hold time for overlaid spectra");
  return 4;
}

Assistant:

int InternalRegisterEffectDefinition(UnityAudioEffectDefinition& definition)
    {
        int numparams = P_NUM;
        definition.paramdefs = new UnityAudioParameterDefinition[numparams];
        RegisterParameter(definition, "Window", "s", 0.01f, 2.0f, 0.1f, 1.0f, 3.0f, P_Window, "Length of analysis window");
        RegisterParameter(definition, "Scale", "%", 0.01f, 10.0f, 1.0f, 100.0f, 3.0f, P_Scale, "Amplitude scaling for monitored signal");
        RegisterParameter(definition, "Mode", "", 0.0f, 3.0f, 0.0f, 1.0f, 1.0f, P_Mode, "Display mode (0=scope, 1=spectrum, 2=spectrogram)");
        RegisterParameter(definition, "SpectrumDecay", "dB/s", -100.0f, 0.0f, -10.0f, 1.0f, 1.0f, P_SpectrumDecay, "Hold time for overlaid spectra");
        return numparams;
    }